

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal_operations.cpp
# Opt level: O0

void Am_Update_All(void)

{
  Am_Window_ToDo **ppAVar1;
  Am_Window_ToDo *prev;
  bool bVar2;
  Am_Value *value;
  Am_Object local_40 [3];
  Am_Object local_28;
  Am_Object win;
  Am_Draw_Method draw_method;
  Am_Window_ToDo *current;
  
  bVar2 = Am_Demon_Queue::Empty(&Main_Demon_Queue);
  if (!bVar2) {
    Am_Demon_Queue::Invoke(&Main_Demon_Queue);
  }
  Am_Demon_Queue::Prevent_Invoke(&Main_Demon_Queue);
  Am_State_Store::Invoke();
  Am_Draw_Method::Am_Draw_Method((Am_Draw_Method *)&win);
  Am_Object::Am_Object(&local_28);
  while (prev = Window_ToDo_Head, Window_ToDo_Head != (Am_Window_ToDo *)0x0) {
    if (Window_ToDo_Head->next == (Am_Window_ToDo *)0x0) {
      Window_ToDo_Tail = (Am_Window_ToDo *)0x0;
    }
    ppAVar1 = &Window_ToDo_Head->next;
    Window_ToDo_Head = Window_ToDo_Head->next;
    *ppAVar1 = (Am_Window_ToDo *)0x0;
    prev->prev = (Am_Window_ToDo *)0x0;
    Am_Object::operator=(&local_28,&prev->window);
    bVar2 = Am_Object::Valid(&local_28);
    if (bVar2) {
      value = Am_Object::Get(&local_28,2000,0);
      Am_Draw_Method::operator=((Am_Draw_Method *)&win,value);
      Am_Object::Am_Object(local_40,&local_28);
      (*(code *)draw_method.from_wrapper)(local_40,0,0);
      Am_Object::~Am_Object(local_40);
    }
  }
  Am_Demon_Queue::Release_Invoke(&Main_Demon_Queue);
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

void
Am_Update_All()
{
  if (!Main_Demon_Queue.Empty())
    Main_Demon_Queue.Invoke();

  Main_Demon_Queue.Prevent_Invoke();
  Am_State_Store::Invoke();
  Am_Window_ToDo *current;
  Am_Draw_Method draw_method;
#ifdef DEBUG
  int was_inprogress;
#endif
  Am_Object win;
  while (Window_ToDo_Head) {
    current = Window_ToDo_Head;
    Window_ToDo_Head = Window_ToDo_Head->next;
    if (!Window_ToDo_Head)
      Window_ToDo_Tail = nullptr;
    current->next = nullptr;
    current->prev = nullptr;
    win = current->window;
    if (win.Valid()) {
#ifdef DEBUG
      was_inprogress = win.Get(Am_OBJECT_IN_PROGRESS, Am_RETURN_ZERO_ON_ERROR);
      if (was_inprogress & 1) {
        std::cerr << "** Draw on window " << win
                  << " but crashed last time, so skipping it.\n"
                  << std::flush;
        continue; //skip this object
      } else
        win.Set(Am_OBJECT_IN_PROGRESS, 1, Am_OK_IF_NOT_THERE);
#endif
      draw_method = win.Get(Am_DRAW_METHOD);
      draw_method.Call(win, nullptr, 0, 0);
#ifdef DEBUG
      win.Set(Am_OBJECT_IN_PROGRESS, 0);
#endif
    }
  }
  Main_Demon_Queue.Release_Invoke();
}